

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::RegisterEntryPoint
          (ValidationState_t *this,uint32_t id,ExecutionModel execution_model,
          EntryPointDescription *desc)

{
  mapped_type *this_00;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>>
  *this_01;
  EntryPointDescription *desc_local;
  ExecutionModel execution_model_local;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  desc_local._0_4_ = execution_model;
  desc_local._4_4_ = id;
  _execution_model_local = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->entry_points_,(value_type_conflict3 *)((long)&desc_local + 4));
  this_00 = std::
            unordered_map<unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>_>_>_>
            ::operator[](&this->entry_point_to_execution_models_,(key_type *)((long)&desc_local + 4)
                        );
  std::
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>::
  insert(this_00,(value_type *)&desc_local);
  this_01 = (vector<spvtools::val::ValidationState_t::EntryPointDescription,std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>>
             *)std::
               unordered_map<unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>_>
               ::operator[](&this->entry_point_descriptions_,(key_type *)((long)&desc_local + 4));
  std::
  vector<spvtools::val::ValidationState_t::EntryPointDescription,std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>>
  ::emplace_back<spvtools::val::ValidationState_t::EntryPointDescription&>(this_01,desc);
  return;
}

Assistant:

void RegisterEntryPoint(const uint32_t id,
                          spv::ExecutionModel execution_model,
                          EntryPointDescription&& desc) {
    entry_points_.push_back(id);
    entry_point_to_execution_models_[id].insert(execution_model);
    entry_point_descriptions_[id].emplace_back(desc);
  }